

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameColumnExprCb(Walker *pWalker,Expr *pExpr)

{
  RenameCtx *pCtx;
  char *in_RSI;
  long *in_RDI;
  RenameCtx *p;
  
  pCtx = (RenameCtx *)in_RDI[5];
  if (((*in_RSI == 'N') && ((int)*(short *)(in_RSI + 0x30) == pCtx->iCol)) &&
     (*(Table **)(*in_RDI + 0xb8) == pCtx->pTab)) {
    renameTokenFind((Parse *)*in_RDI,pCtx,in_RSI);
  }
  else if (((*in_RSI == -0x58) && ((int)*(short *)(in_RSI + 0x30) == pCtx->iCol)) &&
          (((*(uint *)(in_RSI + 4) & 0x3000000) == 0 && (pCtx->pTab == *(Table **)(in_RSI + 0x40))))
          ) {
    renameTokenFind((Parse *)*in_RDI,pCtx,in_RSI);
  }
  return 0;
}

Assistant:

static int renameColumnExprCb(Walker *pWalker, Expr *pExpr){
  RenameCtx *p = pWalker->u.pRename;
  if( pExpr->op==TK_TRIGGER
   && pExpr->iColumn==p->iCol
   && pWalker->pParse->pTriggerTab==p->pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }else if( pExpr->op==TK_COLUMN
   && pExpr->iColumn==p->iCol
   && ALWAYS(ExprUseYTab(pExpr))
   && p->pTab==pExpr->y.pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)pExpr);
  }
  return WRC_Continue;
}